

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkylineBinPack.cpp
# Opt level: O1

void __thiscall SkylineBinPack::Init(SkylineBinPack *this,int width,int height,bool useWasteMap_)

{
  uint *puVar1;
  SkylineNode *pSVar2;
  uint uVar3;
  SkylineNode *pSVar4;
  
  this->binWidth = width;
  this->binHeight = height;
  this->useWasteMap = useWasteMap_;
  if ((this->disjointRects).rects.Count != 0) {
    (this->disjointRects).rects.Count = 0;
  }
  this->usedSurfaceArea = 0;
  if ((this->skyLine).Count != 0) {
    (this->skyLine).Count = 0;
  }
  TArray<SkylineBinPack::SkylineNode,_SkylineBinPack::SkylineNode>::Grow(&this->skyLine,1);
  pSVar4 = (this->skyLine).Array;
  uVar3 = (this->skyLine).Count;
  pSVar2 = pSVar4 + uVar3;
  pSVar2->x = 0;
  pSVar2->y = 0;
  pSVar4[uVar3].width = width;
  puVar1 = &(this->skyLine).Count;
  *puVar1 = *puVar1 + 1;
  if (this->useWasteMap == true) {
    GuillotineBinPack::Init(&this->wasteMap,width,height);
    if ((this->wasteMap).freeRectangles.Count != 0) {
      (this->wasteMap).freeRectangles.Count = 0;
    }
  }
  return;
}

Assistant:

void SkylineBinPack::Init(int width, int height, bool useWasteMap_)
{
	binWidth = width;
	binHeight = height;

	useWasteMap = useWasteMap_;

#ifdef _DEBUG
	disjointRects.Clear();
#endif

	usedSurfaceArea = 0;
	skyLine.Clear();
	SkylineNode node;
	node.x = 0;
	node.y = 0;
	node.width = binWidth;
	skyLine.Push(node);

	if (useWasteMap)
	{
		wasteMap.Init(width, height);
		wasteMap.GetFreeRectangles().Clear();
	}
}